

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex_interface.cpp
# Opt level: O0

char * SoPlex_objValueRationalString(void *soplex)

{
  char *pcVar1;
  size_t sVar2;
  char *__src;
  undefined8 in_RDI;
  SoPlex *so;
  string objstring;
  char *value;
  unsigned_long stringlength;
  fmtflags in_stack_ffffffffffffff1c;
  streamsize in_stack_ffffffffffffff20;
  SoPlexBase<double> *in_stack_ffffffffffffff28;
  string local_60 [32];
  undefined8 local_40;
  string local_38 [32];
  char *local_18;
  ulong local_10;
  undefined8 local_8;
  
  local_8 = in_RDI;
  std::__cxx11::string::string(local_38);
  local_40 = local_8;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  sVar2 = strlen(pcVar1);
  local_10 = sVar2 + 1;
  ::soplex::SoPlexBase<double>::objValueRational(in_stack_ffffffffffffff28);
  boost::multiprecision::
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
  ::str_abi_cxx11_((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                    *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c)
  ;
  std::__cxx11::string::operator=(local_38,local_60);
  std::__cxx11::string::~string(local_60);
  boost::multiprecision::
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
             *)0x1a6268);
  pcVar1 = (char *)operator_new__(local_10);
  local_18 = pcVar1;
  __src = (char *)std::__cxx11::string::c_str();
  strncpy(pcVar1,__src,local_10);
  std::__cxx11::string::~string(local_38);
  return local_18;
}

Assistant:

char* SoPlex_objValueRationalString(void* soplex)
{
#ifndef SOPLEX_WITH_BOOST
   throw SPxException("Rational functions cannot be used when built without Boost.");
#endif
   /* coverity[unreachable] */
   long unsigned int stringlength;
   char* value;
   std::string objstring;
   SoPlex* so = (SoPlex*)(soplex);

   stringlength = strlen(objstring.c_str()) + 1;
   objstring = so->objValueRational().str();
   value = new char[stringlength];
   strncpy(value, objstring.c_str(), stringlength);
   return value;
}